

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerWithAttr::SetProperty
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,
          JavascriptString *propertyNameString,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  JavascriptString *instance_00;
  PropertyId propertyId;
  BOOL BVar1;
  ScriptContext *this_00;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  PropertyValueInfo *info_local;
  Var pvStack_28;
  PropertyOperationFlags flags_local;
  Var value_local;
  JavascriptString *propertyNameString_local;
  DynamicObject *instance_local;
  PathTypeHandlerWithAttr *this_local;
  
  propertyRecord = (PropertyRecord *)info;
  info_local._4_4_ = flags;
  pvStack_28 = value;
  value_local = propertyNameString;
  propertyNameString_local = (JavascriptString *)instance;
  instance_local = (DynamicObject *)this;
  this_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  ScriptContext::GetOrAddPropertyRecord(this_00,(JavascriptString *)value_local,&local_40);
  instance_00 = propertyNameString_local;
  propertyId = PropertyRecord::GetPropertyId(local_40);
  BVar1 = SetProperty(this,(DynamicObject *)instance_00,propertyId,pvStack_28,info_local._4_4_,
                      (PropertyValueInfo *)propertyRecord);
  return BVar1;
}

Assistant:

BOOL PathTypeHandlerWithAttr::SetProperty(DynamicObject* instance, JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        // Consider: Implement actual string hash lookup
        PropertyRecord const* propertyRecord;
        instance->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        return PathTypeHandlerWithAttr::SetProperty(instance, propertyRecord->GetPropertyId(), value, flags, info);
    }